

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

bool __thiscall BeliefSparse::SanityCheck(BeliefSparse *this)

{
  bool bVar1;
  uint uVar2;
  const_reference pdVar3;
  size_type sVar4;
  int __x;
  long in_RDI;
  double dVar5;
  BScit it;
  double sum;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff78;
  bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
  *in_stack_ffffffffffffff80;
  const_iterator *in_stack_ffffffffffffff90;
  int local_48;
  const_iterator local_28;
  double local_18;
  byte local_1;
  
  local_18 = 0.0;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::begin(in_stack_ffffffffffffff78);
  do {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::end(in_stack_ffffffffffffff78);
    bVar1 = boost::numeric::ublas::
            bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
            ::operator!=(in_stack_ffffffffffffff80,
                         (derived_iterator_type *)in_stack_ffffffffffffff78);
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::const_iterator::~const_iterator((const_iterator *)0x9c2842);
    if (!bVar1) {
      local_48 = 2;
LAB_009c296e:
      __x = (int)&local_28;
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::const_iterator::~const_iterator((const_iterator *)0x9c2978);
      if (local_48 != 1) {
        dVar5 = local_18 - 1.0;
        std::abs(__x);
        if (dVar5 <= 1e-12) {
          sVar4 = boost::numeric::ublas::
                  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::size((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                          *)(in_RDI + 8));
          if (sVar4 == 0) {
            local_1 = 0;
          }
          else {
            local_1 = 1;
          }
        }
        else {
          local_1 = 0;
        }
      }
      return (bool)(local_1 & 1);
    }
    pdVar3 = boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::const_iterator::operator*(in_stack_ffffffffffffff90);
    if (*pdVar3 < 0.0) {
      local_1 = 0;
      local_48 = 1;
      goto LAB_009c296e;
    }
    pdVar3 = boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::const_iterator::operator*(in_stack_ffffffffffffff90);
    if (1.000000000001 < *pdVar3) {
      local_1 = 0;
      local_48 = 1;
      goto LAB_009c296e;
    }
    in_stack_ffffffffffffff90 =
         (const_iterator *)
         boost::numeric::ublas::
         compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
         ::const_iterator::operator*(in_stack_ffffffffffffff90);
    uVar2 = std::isnan((double)(in_stack_ffffffffffffff90->
                               super_container_const_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                               ).c_);
    if ((uVar2 & 1) != 0) {
      local_1 = 0;
      local_48 = 1;
      goto LAB_009c296e;
    }
    in_stack_ffffffffffffff80 =
         (bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
          *)boost::numeric::ublas::
            compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator::operator*(in_stack_ffffffffffffff90);
    local_18 = *(double *)in_stack_ffffffffffffff80 + local_18;
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::const_iterator::operator++(&local_28);
  } while( true );
}

Assistant:

bool BeliefSparse::SanityCheck() const
{
    // check for negative and entries>1
    double sum=0;
    for(BScit it=_m_b.begin();
        it!=_m_b.end(); ++it)
    {
        if(*it<0)
            return(false);
        if(*it>1 + PROB_PRECISION)
            return(false);
        if(std::isnan(*it))
            return(false);
        sum+=*it;
    }

    // check if sums to 1
    if(abs(sum-1)>PROB_PRECISION)
        return(false);

    // check whether the size is not zero
    if(_m_b.size()==0)
        return(false);

    // if we haven't returned yet, the belief is fine
    return(true);
}